

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_tools.cpp
# Opt level: O1

QSimpleParsedNumber<long_long> qstrntoll(char *begin,qsizetype size,int base)

{
  byte *stop;
  byte *pbVar1;
  long lVar2;
  byte bVar3;
  long lVar4;
  int __base;
  int iVar5;
  byte *pbVar6;
  long in_FS_OFFSET;
  bool bVar7;
  bool bVar8;
  R_conflict1 RVar9;
  QSimpleParsedNumber<long_long> QVar10;
  __integer_from_chars_result_type<long_long> _Var11;
  unsigned_long_long check;
  longlong result;
  unsigned_long_long local_48;
  longlong local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  stop = (byte *)(begin + size);
  bVar7 = 0 < size;
  pbVar6 = (byte *)begin;
  if (size < 1) {
    bVar8 = false;
  }
  else {
    bVar3 = *begin;
    if ((bVar3 < 0x40) && ((1L << (bVar3 & 0x3f) & 0x100003e00U) != 0)) {
      pbVar1 = (byte *)(begin + 1);
      do {
        pbVar6 = pbVar1;
        bVar7 = pbVar6 < stop;
        if (!bVar7) {
          bVar8 = false;
          goto LAB_0011c43a;
        }
        bVar3 = *pbVar6;
      } while ((bVar3 < 0x40) && (pbVar1 = pbVar6 + 1, (1L << (bVar3 & 0x3f) & 0x100003e00U) != 0));
    }
    bVar8 = bVar3 == 0x2d;
  }
LAB_0011c43a:
  if ((bVar8) || ((bVar7 && (*pbVar6 == 0x2b)))) {
    pbVar6 = pbVar6 + 1;
  }
  RVar9 = scanPrefix((char *)pbVar6,(char *)stop,base);
  pbVar6 = (byte *)RVar9.next;
  __base = RVar9.base;
  if (pbVar6 < stop && __base != 0) {
    bVar3 = *pbVar6;
    if (0x2f < (char)bVar3) {
      iVar5 = 10;
      if (__base < 10) {
        iVar5 = __base;
      }
      if ((char)bVar3 + -0x30 < iVar5) {
LAB_0011c4b4:
        local_40 = 0;
        _Var11 = std::from_chars<long_long>((char *)pbVar6,(char *)stop,&local_40,__base);
        if ((bool)(_Var11.ec == result_out_of_range & bVar8)) {
          lVar4 = 0;
          local_48 = 0;
          std::from_chars<unsigned_long_long>((char *)pbVar6,(char *)stop,&local_48,__base);
          lVar2 = 0;
          goto LAB_0011c478;
        }
        if (_Var11.ec == 0) {
          lVar2 = -local_40;
          if (!bVar8) {
            lVar2 = local_40;
          }
          lVar4 = (long)_Var11.ptr - (long)begin;
          goto LAB_0011c478;
        }
      }
      else if (10 < __base) {
        lVar2 = 0;
        if (0x60 < (bVar3 | 0x20)) {
          lVar4 = 0;
          if (__base + 0x57 <= (int)(uint)(bVar3 | 0x20)) goto LAB_0011c478;
          goto LAB_0011c4b4;
        }
      }
    }
  }
  lVar2 = 0;
  lVar4 = 0;
LAB_0011c478:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar10.used = lVar4;
    QVar10.result = lVar2;
    return QVar10;
  }
  __stack_chk_fail();
}

Assistant:

QSimpleParsedNumber<qlonglong> qstrntoll(const char *begin, qsizetype size, int base)
{
    const char *p = begin, *const stop = begin + size;
    while (p < stop && ascii_isspace(*p))
        ++p;
    // Frustratingly, std::from_chars() doesn't cope with a 0x prefix that might
    // be between the sign and digits, so we have to handle that for it, which
    // means we can't use its ability to read LLONG_MIN directly; see below.
    const bool negate = p < stop && *p == '-';
    if (negate || (p < stop && *p == '+'))
        ++p;

    const auto prefix = scanPrefix(p, stop, base);
    // Must check for digit, as from_chars() will accept a sign, which would be
    // a second sign, that we should reject.
    if (!prefix.base || prefix.next >= stop || !isDigitForBase(*prefix.next, prefix.base))
        return { };

    long long result = 0;
    auto res = std::from_chars(prefix.next, stop, result, prefix.base);
    if (negate && res.ec == std::errc::result_out_of_range) {
        // Maybe LLONG_MIN:
        unsigned long long check = 0;
        res = std::from_chars(prefix.next, stop, check, prefix.base);
        if (res.ec == std::errc{} && check + std::numeric_limits<long long>::min() == 0)
            return { std::numeric_limits<long long>::min(), res.ptr - begin };
        return { };
    }
    if (res.ec != std::errc{})
        return { };
    return { negate ? -result : result, res.ptr - begin };
}